

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha_blocks_ref.c
# Opt level: O0

uint32_t U8TO32(uint8_t *p)

{
  uint8_t *p_local;
  
  return *(uint32_t *)p;
}

Assistant:

static uint32_t
U8TO32(const uint8_t *p) {
    return
        (((uint32_t)(p[0])      ) |
         ((uint32_t)(p[1]) <<  8) |
         ((uint32_t)(p[2]) << 16) |
         ((uint32_t)(p[3]) << 24));
}